

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffcfmt(char *tform,char *cform)

{
  int iVar1;
  ushort **ppuVar2;
  char *in_RSI;
  long in_RDI;
  bool bVar3;
  bool bVar4;
  int npt;
  int isgood;
  int istart;
  int ii;
  int local_20;
  int local_14;
  
  *in_RSI = '\0';
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    bVar3 = false;
    if (*(char *)(in_RDI + local_14) != '\0') {
      bVar3 = *(char *)(in_RDI + local_14) == ' ';
    }
    if (!bVar3) break;
    local_14 = local_14 + 1;
  }
  if (*(char *)(in_RDI + local_14) != '\0') {
    bVar3 = true;
    local_20 = 0;
    if ((((*(char *)(in_RDI + local_14) != 'A') && (*(char *)(in_RDI + local_14) != 'I')) &&
        (*(char *)(in_RDI + local_14) != 'F')) &&
       ((*(char *)(in_RDI + local_14) != 'E' && (*(char *)(in_RDI + local_14) != 'D')))) {
      bVar3 = false;
    }
    while( true ) {
      local_14 = local_14 + 1;
      bVar4 = false;
      if (bVar3) {
        bVar4 = *(char *)(in_RDI + local_14) != '\0';
      }
      if (!bVar4) break;
      if (*(char *)(in_RDI + local_14) == '.') {
        if (local_20 < 1) {
          local_20 = local_20 + 1;
        }
        else {
          bVar3 = false;
        }
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*(char *)(in_RDI + local_14)] & 0x800) == 0) {
          bVar3 = false;
        }
      }
    }
    if (bVar3) {
      *in_RSI = '%';
      strcpy(in_RSI + 1,(char *)(in_RDI + (iVar1 + 1)));
      if (*(char *)(in_RDI + iVar1) == 'A') {
        strcat(in_RSI,"s");
      }
      else if (*(char *)(in_RDI + iVar1) == 'I') {
        strcat(in_RSI,".0f");
      }
      if (*(char *)(in_RDI + iVar1) == 'F') {
        strcat(in_RSI,"f");
      }
      if (*(char *)(in_RDI + iVar1) == 'E') {
        strcat(in_RSI,"E");
      }
      if (*(char *)(in_RDI + iVar1) == 'D') {
        strcat(in_RSI,"E");
      }
    }
  }
  return;
}

Assistant:

void ffcfmt(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS format string for an ASCII Table extension column into the
  equivalent C format string that can be used in a printf statement, after
  the values have been read as a double.
*/
{
    int ii, istart, isgood, npt;
    
    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
        return;    /* input format string was blank */
    istart = ii;
    
    isgood = 1;
    npt = 0;
    if (tform[ii] != 'A' && tform[ii] != 'I' && tform[ii] != 'F'
                 && tform[ii] != 'E' && tform[ii] != 'D')
       isgood = 0;
    ii++;
    while (isgood && tform[ii] != 0)
    {
       /* one period is allowed */
       if (tform[ii] == '.')
       {
          if (npt > 0)
            isgood = 0;
          else
            ++npt; 
       }
       else if (!isdigit(tform[ii]))
          isgood = 0;
       ++ii; 
    }
    if (!isgood)
       return;

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[istart + 1]); /* append the width and decimal code */


    if (tform[istart] == 'A')
        strcat(cform, "s");
    else if (tform[istart] == 'I')
        strcat(cform, ".0f");  /*  0 precision to suppress decimal point */
    if (tform[istart] == 'F')
        strcat(cform, "f");
    if (tform[istart] == 'E')
        strcat(cform, "E");
    if (tform[istart] == 'D')
        strcat(cform, "E");

    return;
}